

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindow.cpp
# Opt level: O1

bool __thiscall QMainWindow::event(QMainWindow *this,QEvent *event)

{
  ushort uVar1;
  long lVar2;
  QLayoutItem *pQVar3;
  bool bVar4;
  undefined4 extraout_EAX;
  uint uVar5;
  QStatusBar *this_00;
  ulong uVar6;
  QPoint QVar7;
  QMainWindowLayout *pQVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  QPointF QVar12;
  QPoint local_50;
  QString local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QWidget).field_0x8;
  if ((((*(long *)(lVar2 + 600) != 0) && (*(int *)(*(long *)(lVar2 + 600) + 4) != 0)) &&
      (*(long *)(lVar2 + 0x260) != 0)) &&
     (bVar4 = QMainWindowLayoutSeparatorHelper<QMainWindowLayout>::windowEvent
                        ((QMainWindowLayoutSeparatorHelper<QMainWindowLayout> *)
                         (*(long *)(lVar2 + 0x260) + 0x20),event), bVar4)) goto LAB_004327bc;
  uVar1 = *(ushort *)(event + 8);
  if (uVar1 < 100) {
    switch(uVar1) {
    case 0x3c:
    case 0x3f:
      if (*(long *)(*(long *)(lVar2 + 0x260) + 0x808) != 0) {
LAB_00432767:
        event[0xc] = (QEvent)0x1;
        goto LAB_004327bc;
      }
      break;
    case 0x3d:
      if (*(long *)(*(long *)(lVar2 + 0x260) + 0x808) != 0) {
        if (*(int *)(*(long *)(lVar2 + 600) + 4) == 0) {
          pQVar8 = (QMainWindowLayout *)0x0;
        }
        else {
          pQVar8 = *(QMainWindowLayout **)(lVar2 + 0x260);
        }
        pQVar3 = *(QLayoutItem **)(*(long *)(lVar2 + 0x260) + 0x808);
        local_48.d.d = *(Data **)(event + 0x10);
        local_48.d.ptr = *(char16_t **)(event + 0x18);
        QVar12 = QWidget::mapToGlobal(&this->super_QWidget,(QPointF *)&local_48);
        auVar11._0_8_ =
             (double)((ulong)QVar12.yp & 0x8000000000000000 | 0x3fe0000000000000) + QVar12.yp;
        auVar11._8_8_ =
             (double)((ulong)QVar12.xp & 0x8000000000000000 | 0x3fe0000000000000) + QVar12.xp;
        auVar11 = minpd(_DAT_0066f5d0,auVar11);
        auVar10._8_8_ = -(ulong)(-2147483648.0 < auVar11._8_8_);
        auVar10._0_8_ = -(ulong)(-2147483648.0 < auVar11._0_8_);
        uVar5 = movmskpd(extraout_EAX,auVar10);
        uVar9 = 0x8000000000000000;
        if ((uVar5 & 1) != 0) {
          uVar9 = (ulong)(uint)(int)auVar11._0_8_ << 0x20;
        }
        uVar6 = 0x80000000;
        if ((uVar5 & 2) != 0) {
          uVar6 = (ulong)(uint)(int)auVar11._8_8_;
        }
        local_50 = (QPoint)(uVar6 | uVar9);
        QMainWindowLayout::hover(pQVar8,pQVar3,&local_50);
        goto LAB_00432767;
      }
      break;
    case 0x3e:
      if (*(long *)(*(long *)(lVar2 + 0x260) + 0x808) != 0) {
        if (*(int *)(*(long *)(lVar2 + 600) + 4) == 0) {
          pQVar8 = (QMainWindowLayout *)0x0;
        }
        else {
          pQVar8 = *(QMainWindowLayout **)(lVar2 + 0x260);
        }
        pQVar3 = *(QLayoutItem **)(*(long *)(lVar2 + 0x260) + 0x808);
        QVar7 = QWidget::pos(&this->super_QWidget);
        local_48.d.d = (Data *)(((ulong)(QVar7.xp.m_i.m_i + 1) | (ulong)QVar7 & 0xffffffff00000000)
                               + 0x100000000);
        QMainWindowLayout::hover(pQVar8,pQVar3,(QPoint *)&local_48);
        goto LAB_004327bc;
      }
    }
  }
  else {
    if (uVar1 != 100) {
      if (uVar1 == 0x70) {
        this_00 = QMainWindowLayout::statusBar(*(QMainWindowLayout **)(lVar2 + 0x260));
        if (this_00 == (QStatusBar *)0x0) {
          event[0xc] = (QEvent)0x0;
        }
        else {
          local_48.d.d = *(Data **)(event + 0x10);
          local_48.d.ptr = *(char16_t **)(event + 0x18);
          local_48.d.size = *(qsizetype *)(event + 0x20);
          if ((QSize)local_48.d.d != (QSize)0x0) {
            LOCK();
            *(int *)local_48.d.d = *(int *)local_48.d.d + 1;
            UNLOCK();
          }
          QStatusBar::showMessage(this_00,&local_48,0);
          if ((QSize)local_48.d.d != (QSize)0x0) {
            LOCK();
            *(int *)local_48.d.d = *(int *)local_48.d.d + -1;
            UNLOCK();
            if (*(int *)local_48.d.d == 0) {
              QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
      }
      else {
        if (uVar1 != 0x78) goto switchD_00432506_default;
        QMainWindowLayout::toggleToolBarsVisible(*(QMainWindowLayout **)(lVar2 + 0x260));
      }
LAB_004327bc:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        return true;
      }
      goto LAB_004327da;
    }
    QDockAreaLayout::styleChangedEvent((QDockAreaLayout *)(*(long *)(lVar2 + 0x260) + 0x1a0));
    if (*(char *)(lVar2 + 0x270) == '\0') {
      local_48.d.d = (Data *)0xffffffffffffffff;
      setIconSize(this,(QSize *)&local_48);
    }
  }
switchD_00432506_default:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    bVar4 = QWidget::event(&this->super_QWidget,event);
    return bVar4;
  }
LAB_004327da:
  __stack_chk_fail();
}

Assistant:

bool QMainWindow::event(QEvent *event)
{
    Q_D(QMainWindow);

#if QT_CONFIG(dockwidget)
    if (d->layout && d->layout->windowEvent(event))
        return true;
#endif

    switch (event->type()) {

#if QT_CONFIG(toolbar)
        case QEvent::ToolBarChange: {
            Q_ASSERT(d->layout);
            d->layout->toggleToolBarsVisible();
            return true;
        }
#endif

#if QT_CONFIG(statustip)
        case QEvent::StatusTip:
#if QT_CONFIG(statusbar)
            Q_ASSERT(d->layout);
            if (QStatusBar *sb = d->layout->statusBar())
                sb->showMessage(static_cast<QStatusTipEvent*>(event)->tip());
            else
#endif
                static_cast<QStatusTipEvent*>(event)->ignore();
            return true;
#endif // QT_CONFIG(statustip)

        case QEvent::StyleChange:
#if QT_CONFIG(dockwidget)
            Q_ASSERT(d->layout);
            d->layout->layoutState.dockAreaLayout.styleChangedEvent();
#endif
            if (!d->explicitIconSize)
                setIconSize(QSize());
            break;
#if QT_CONFIG(draganddrop)
        case QEvent::DragEnter:
        case QEvent::Drop:
            if (!d->layout->draggingWidget)
                break;
            event->accept();
            return true;
        case QEvent::DragMove: {
            if (!d->layout->draggingWidget)
                break;
            auto dragMoveEvent = static_cast<QDragMoveEvent *>(event);
            d->layout->hover(d->layout->draggingWidget,
                             mapToGlobal(dragMoveEvent->position()).toPoint());
            event->accept();
            return true;
        }
        case QEvent::DragLeave:
            if (!d->layout->draggingWidget)
                break;
            d->layout->hover(d->layout->draggingWidget, pos() - QPoint(-1, -1));
            return true;
#endif
        default:
            break;
    }

    return QWidget::event(event);
}